

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

void __thiscall miniros::RPCManager::serverThreadFunc(RPCManager *this)

{
  XmlRpcDispatch *pXVar1;
  char cVar2;
  _Base_ptr p_Var3;
  _Base_ptr in_RSI;
  set<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  *__range3;
  scoped_lock<std::mutex> lock_2;
  scoped_lock<std::mutex> lock;
  scoped_lock<std::mutex> lock_1;
  WallDuration local_38;
  
  disableAllSignalsInThisThread();
  setThreadName("RPCManager");
  pXVar1 = &(this->server_)._disp;
  while( true ) {
    if (((this->shutting_down_)._M_base._M_i & 1U) != 0) {
      return;
    }
    std::mutex::lock(&this->added_connections_mutex_);
    for (p_Var3 = (this->added_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->added_connections_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
      (**(code **)(**(long **)(p_Var3 + 1) + 0x10))(*(long **)(p_Var3 + 1),pXVar1);
      in_RSI = p_Var3 + 1;
      std::
      _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>>>
      ::_M_insert_unique<std::shared_ptr<miniros::ASyncXMLRPCConnection>const&>
                ((_Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::shared_ptr<miniros::ASyncXMLRPCConnection>,std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>>,std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>>>
                  *)&this->connections_,(shared_ptr<miniros::ASyncXMLRPCConnection> *)in_RSI);
    }
    std::
    _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
    ::clear(&(this->added_connections_)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)&this->added_connections_mutex_);
    std::mutex::lock(&this->functions_mutex_);
    XmlRpc::XmlRpcServer::work(&this->server_,0.1);
    pthread_mutex_unlock((pthread_mutex_t *)&this->functions_mutex_);
    while (((this->unbind_requested_)._M_base._M_i & 1U) != 0) {
      WallDuration::WallDuration(&local_38,0.01);
      WallDuration::sleep(&local_38,(uint)in_RSI);
    }
    if (((this->shutting_down_)._M_base._M_i & 1U) != 0) break;
    for (p_Var3 = (this->connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->connections_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
      cVar2 = (**(code **)(**(long **)(p_Var3 + 1) + 0x20))();
      if (cVar2 != '\0') {
        in_RSI = p_Var3 + 1;
        removeASyncConnection(this,(ASyncXMLRPCConnectionPtr *)in_RSI);
      }
    }
    std::mutex::lock(&this->removed_connections_mutex_);
    for (p_Var3 = (this->removed_connections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->removed_connections_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
      (**(code **)(**(long **)(p_Var3 + 1) + 0x18))(*(long **)(p_Var3 + 1),pXVar1);
      in_RSI = p_Var3 + 1;
      std::
      _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
      ::erase(&(this->connections_)._M_t,(key_type *)in_RSI);
    }
    std::
    _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
    ::clear(&(this->removed_connections_)._M_t);
    pthread_mutex_unlock((pthread_mutex_t *)&this->removed_connections_mutex_);
  }
  return;
}

Assistant:

void RPCManager::serverThreadFunc()
{
  disableAllSignalsInThisThread();
  setThreadName("RPCManager");

  while(!shutting_down_)
  {
    {
      std::scoped_lock<std::mutex> lock(added_connections_mutex_);
      auto it = added_connections_.begin();
      auto end = added_connections_.end();
      for (; it != end; ++it)
      {
        (*it)->addToDispatch(server_.get_dispatch());
        connections_.insert(*it);
      }

      added_connections_.clear();
    }

    // Update the XMLRPC server, blocking for at most 100ms in select()
    {
      std::scoped_lock<std::mutex> lock(functions_mutex_);
      server_.work(0.1);
    }

    while (unbind_requested_)
    {
      WallDuration(0.01).sleep();
    }

    if (shutting_down_)
    {
      return;
    }

    {
      for (auto& connection: connections_)
      {
        if (connection->check())
          removeASyncConnection(connection);
      }
    }

    {
      std::scoped_lock<std::mutex> lock(removed_connections_mutex_);
      auto it = removed_connections_.begin();
      auto end = removed_connections_.end();
      for (; it != end; ++it)
      {
        (*it)->removeFromDispatch(server_.get_dispatch());
        connections_.erase(*it);
      }

      removed_connections_.clear();
    }
  }
}